

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::MethodCompiler::visitAssignmentExpression(MethodCompiler *this,AssignmentExpression *node)

{
  int iVar1;
  Node *pNVar2;
  IdentifierExpression *this_00;
  __shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  VariableLookupPtr variable;
  __shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  pNVar2 = AST::AssignmentExpression::getValue(node);
  (*pNVar2->_vptr_Node[2])(pNVar2,this);
  this_00 = (IdentifierExpression *)AST::AssignmentExpression::getReference(node);
  iVar1 = (*(this_00->super_Node)._vptr_Node[4])(this_00);
  if ((char)iVar1 != '\0') {
    p_Var3 = &AST::IdentifierExpression::getVariable(this_00)->
              super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,p_Var3);
    (*(local_20._M_ptr)->_vptr_VariableLookup[7])(local_20._M_ptr,&this->gen,this->localContext);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    return (Oop)&NilObject;
  }
  fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
          "virtual Oop Lodtalk::MethodCompiler::visitAssignmentExpression(AssignmentExpression *)",
          "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
          ,0x455);
  abort();
}

Assistant:

Oop MethodCompiler::visitAssignmentExpression(AssignmentExpression *node)
{
    // Generate the value
    auto value = node->getValue();
    value->acceptVisitor(this);

    // Ensure the reference is an identifier expression.
    auto reference = node->getReference();
    if(!reference->isIdentifierExpression())
        LODTALK_UNIMPLEMENTED();

    // Perform the assignment.
    auto identExpr = static_cast<AST::IdentifierExpression*> (reference);
    auto variable = identExpr->getVariable();
    variable->generateStore(gen, localContext);

    return Oop();
}